

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O3

void __thiscall
fmt::v11::detail::buffer<char>::append<char>(buffer<char> *this,char *begin,char *end)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  
  if (begin != end) {
    do {
      uVar5 = (long)end - (long)begin;
      if ((long)uVar5 < 0) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O3/_deps/fmt-src/include/fmt/base.h"
                    ,0x1b6,"negative value");
      }
      sVar4 = this->size_;
      uVar2 = this->capacity_;
      if (uVar2 < sVar4 + uVar5) {
        (*this->grow_)(this,sVar4 + uVar5);
        sVar4 = this->size_;
        uVar2 = this->capacity_;
      }
      uVar3 = uVar2 - sVar4;
      if (uVar5 <= uVar2 - sVar4) {
        uVar3 = uVar5;
      }
      if (uVar3 != 0) {
        pcVar1 = this->ptr_;
        uVar5 = 0;
        do {
          pcVar1[uVar5 + sVar4] = begin[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar3 != uVar5);
        sVar4 = this->size_;
      }
      this->size_ = sVar4 + uVar3;
      begin = begin + uVar3;
    } while (begin != end);
  }
  return;
}

Assistant:

void
      append(const U* begin, const U* end) {
    while (begin != end) {
      auto count = to_unsigned(end - begin);
      try_reserve(size_ + count);
      auto free_cap = capacity_ - size_;
      if (free_cap < count) count = free_cap;
      // A loop is faster than memcpy on small sizes.
      T* out = ptr_ + size_;
      for (size_t i = 0; i < count; ++i) out[i] = begin[i];
      size_ += count;
      begin += count;
    }
  }